

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

_Bool list_exists(list *list,void *data)

{
  void **ppvVar1;
  list_item *local_30;
  list_item *cur;
  list_item *next;
  void *data_local;
  list *list_local;
  
  if (list->head == (list_item *)0x0) {
    list_local._7_1_ = false;
  }
  else {
    local_30 = list->head;
    do {
      if (local_30 == (list_item *)0x0) {
        return false;
      }
      ppvVar1 = &local_30->data;
      local_30 = local_30->next;
    } while (*ppvVar1 != data);
    list_local._7_1_ = true;
  }
  return list_local._7_1_;
}

Assistant:

bool list_exists(struct list *list, void *data)
{
    struct list_item *next, *cur = NULL;
    // is list empty?
    if (list->head == NULL) {
        return false;
    }
    cur = list->head;
    while (cur != NULL) {
        next = cur->next;
        if (cur->data == data) {
            return true;
        }
        cur = next;
    }
    return false;
}